

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O3

int run_test_barrier_serial_thread(void)

{
  int iVar1;
  int extraout_EAX;
  uv_barrier_t *barrier_00;
  long lVar2;
  uv_barrier_t barrier;
  uv_thread_t threads [4];
  uv_barrier_t local_58;
  uv_barrier_t uStack_38;
  
  barrier_00 = &local_58;
  iVar1 = uv_barrier_init(&local_58,5);
  if (iVar1 == 0) {
    lVar2 = 0;
    do {
      barrier_00 = (uv_barrier_t *)(uStack_38.__size + lVar2);
      iVar1 = uv_thread_create((uv_thread_t *)&barrier_00->__align,serial_worker,&local_58);
      if (iVar1 != 0) {
        run_test_barrier_serial_thread_cold_2();
        goto LAB_00152592;
      }
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    iVar1 = uv_barrier_wait(&local_58);
    if (0 < iVar1) {
      uv_barrier_destroy(&local_58);
    }
    lVar2 = 0;
    while( true ) {
      barrier_00 = (uv_barrier_t *)(uStack_38.__size + lVar2);
      iVar1 = uv_thread_join((uv_thread_t *)&barrier_00->__align);
      if (iVar1 != 0) break;
      lVar2 = lVar2 + 8;
      if (lVar2 == 0x20) {
        return 0;
      }
    }
LAB_00152592:
    run_test_barrier_serial_thread_cold_3();
  }
  run_test_barrier_serial_thread_cold_1();
  iVar1 = uv_barrier_wait(barrier_00);
  if (0 < iVar1) {
    uv_barrier_destroy(barrier_00);
  }
  uv_sleep(100);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(barrier_serial_thread) {
  uv_thread_t threads[4];
  uv_barrier_t barrier;
  unsigned i;

  ASSERT(0 == uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1));

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT(0 == uv_thread_create(&threads[i], serial_worker, &barrier));

  if (uv_barrier_wait(&barrier) > 0)
    uv_barrier_destroy(&barrier);

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT(0 == uv_thread_join(&threads[i]));

  return 0;
}